

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::PrefixRemover::PrefixRemover
          (PrefixRemover *this,StringPiece prefix)

{
  char cVar1;
  stringpiece_ssize_type sVar2;
  int local_24;
  int i;
  PrefixRemover *this_local;
  StringPiece prefix_local;
  
  prefix_local.ptr_ = (char *)prefix.length_;
  this_local = (PrefixRemover *)prefix.ptr_;
  std::__cxx11::string::string((string *)this);
  local_24 = 0;
  while( true ) {
    sVar2 = StringPiece::size((StringPiece *)&this_local);
    if (sVar2 <= local_24) break;
    cVar1 = StringPiece::operator[]((StringPiece *)&this_local,(long)local_24);
    if (cVar1 != '_') {
      cVar1 = StringPiece::operator[]((StringPiece *)&this_local,(long)local_24);
      cVar1 = ascii_tolower(cVar1);
      std::__cxx11::string::operator+=((string *)this,cVar1);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

PrefixRemover(StringPiece prefix) {
    // Strip underscores and lower-case the prefix.
    for (int i = 0; i < prefix.size(); i++) {
      if (prefix[i] != '_') {
        prefix_ += ascii_tolower(prefix[i]);
      }
    }
  }